

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O2

bool __thiscall
OpenMD::ifstrstream::internalOpen(ifstrstream *this,char *filename,openmode mode,bool param_3)

{
  long lVar1;
  _Ios_Iostate _Var2;
  
  lVar1 = std::filebuf::open(&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x78,
                             (_Ios_Openmode)filename);
  _Var2 = (int)this +
          (int)(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[-3];
  if (lVar1 == 0) {
    std::ios::setstate(_Var2);
  }
  else {
    std::ios::clear(_Var2);
  }
  return lVar1 != 0;
}

Assistant:

bool ifstrstream::internalOpen(const char* filename,
                                 std::ios_base::openmode mode, bool) {
    // in single version, fall back to ifstream
    if (!internalFileBuf_.open(filename, mode)) {
      this->setstate(std::ios_base::failbit);
      return false;
    }

    this->clear();
    return true;
  }